

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_util_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::tools::BufferUtilTest_test_buffer_as_string_Test::
~BufferUtilTest_test_buffer_as_string_Test(BufferUtilTest_test_buffer_as_string_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(BufferUtilTest, test_buffer_as_string)
{
    ByteBuffer buffer1(5);
    unsigned char buffer1_data[5] = {'h', 'e', 'l', 'l', 'o'};
    buffer1.WriteBytes(buffer1_data, 5);
    ASSERT_EQ("hello", BufferUtil::BufferAsString(buffer1));

    ByteBuffer buffer2(3);
    unsigned char buffer2_data[3] = {'1', '2', '3'};
    buffer2.WriteBytes(buffer2_data, 3);
    ASSERT_EQ("123", BufferUtil::BufferAsString(buffer2));

    ByteBuffer buffer3(6);
    unsigned char buffer3_data[6] = {'p', 'i', 'n', 'g', '\r', '\n'};
    buffer3.WriteBytes(buffer3_data, 6);
    ASSERT_EQ("ping\r\n", BufferUtil::BufferAsString(buffer3));
}